

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O0

int arkSetFixedStep(void *arkode_mem,realtype hfixed)

{
  int iVar1;
  N_Vector in_RDI;
  ARKodeMem in_XMM0_Qa;
  ARKodeMem ark_mem;
  int retval;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int local_4;
  
  if (in_RDI == (N_Vector)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode","arkSetFixedStep","arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    if ((((double)in_XMM0_Qa == 0.0) && (!NAN((double)in_XMM0_Qa))) &&
       (*(int *)((long)&in_RDI[3].ops + 4) == 0)) {
      if ((*(int *)&in_RDI[1].content == 1) && (in_RDI[2].content != (void *)0x0)) {
        iVar1 = arkSVtolerances(in_XMM0_Qa,
                                (realtype)
                                CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),in_RDI
                               );
      }
      else {
        iVar1 = arkSStolerances(in_XMM0_Qa,
                                (realtype)
                                CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                                (realtype)in_RDI);
      }
      if (iVar1 != 0) {
        return iVar1;
      }
    }
    if (((double)in_XMM0_Qa != 0.0) || (NAN((double)in_XMM0_Qa))) {
      *(undefined4 *)&in_RDI[0x11].sunctx = 1;
      in_RDI[0xe].sunctx = (SUNContext)in_XMM0_Qa;
    }
    else {
      *(undefined4 *)&in_RDI[0x11].sunctx = 0;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int arkSetFixedStep(void *arkode_mem, realtype hfixed)
{
  int retval;
  ARKodeMem ark_mem;
  if (arkode_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkSetFixedStep", MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;

  /* re-attach internal error weight functions if necessary */
  if ((hfixed == ZERO) && (!ark_mem->user_efun)) {
    if (ark_mem->itol == ARK_SV && ark_mem->Vabstol != NULL)
      retval = arkSVtolerances(ark_mem, ark_mem->reltol, ark_mem->Vabstol);
    else
      retval = arkSStolerances(ark_mem, ark_mem->reltol, ark_mem->Sabstol);
    if (retval != ARK_SUCCESS) return(retval);
  }

  /* set ark_mem entry */
  if (hfixed != ZERO) {
    ark_mem->fixedstep = SUNTRUE;
    ark_mem->hin = hfixed;
  } else {
    ark_mem->fixedstep = SUNFALSE;
  }

  return(ARK_SUCCESS);
}